

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppMemory.h
# Opt level: O0

void __thiscall cppforth::Forth::memResize(Forth *this)

{
  Cell CVar1;
  uint uVar2;
  uint Value;
  uint x;
  reference pvVar3;
  int __fd2;
  int __fd;
  size_type sStack_20;
  Cell oldSize;
  size_type i;
  uint addr;
  Cell size;
  Forth *this_local;
  
  requireDStackDepth(this,2,"RESIZE");
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  Value = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  if (this->vmMaxSegmentSize < uVar2) {
LAB_00138c5d:
    ForthStack<unsigned_int>::setTop(&this->dStack,0xffffffc3);
  }
  else {
    sStack_20 = std::
                vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                ::size(&this->VirtualMemory);
    do {
      sStack_20 = sStack_20 - 1;
      if (sStack_20 < 3) goto LAB_00138c5d;
      pvVar3 = std::
               vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
               ::operator[](&this->VirtualMemory,sStack_20);
    } while (pvVar3->start != Value);
    pvVar3 = std::
             vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
             ::operator[](&this->VirtualMemory,sStack_20);
    CVar1 = pvVar3->end;
    pvVar3 = std::
             vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
             ::operator[](&this->VirtualMemory,sStack_20);
    x = CVar1 - pvVar3->start;
    if (x < uVar2) {
      memAllocate(this);
      __fd = 0;
      uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack,0);
      if (uVar2 == 0) {
        drop(this);
        dup2(this,__fd,__fd2);
        ForthStack<unsigned_int>::push(&this->dStack,x);
        cMove(this);
        swap(this);
        memFree(this);
        ForthStack<unsigned_int>::setTop(&this->dStack,0);
      }
      else {
        pop(this);
        ForthStack<unsigned_int>::setTop(&this->dStack,0xffffffc3);
      }
    }
    else {
      CVar1 = this->VirtualMemoryFreeSegment;
      pvVar3 = std::
               vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
               ::operator[](&this->VirtualMemory,sStack_20);
      if (CVar1 == pvVar3->end) {
        pvVar3 = std::
                 vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                 ::operator[](&this->VirtualMemory,sStack_20);
        this->VirtualMemoryFreeSegment = pvVar3->start + uVar2;
      }
      pvVar3 = std::
               vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
               ::operator[](&this->VirtualMemory,sStack_20);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&pvVar3->segment,(ulong)uVar2);
      pvVar3 = std::
               vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
               ::operator[](&this->VirtualMemory,sStack_20);
      CVar1 = pvVar3->start;
      pvVar3 = std::
               vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
               ::operator[](&this->VirtualMemory,sStack_20);
      pvVar3->end = CVar1 + uVar2;
      ForthStack<unsigned_int>::setTop(&this->dStack,0);
      ForthStack<unsigned_int>::setTop(&this->dStack,1,Value);
    }
  }
  return;
}

Assistant:

void memResize() {
			REQUIRE_DSTACK_DEPTH(2, "RESIZE");
			Cell size = dStack.getTop();
			auto addr = dStack.getTop(1);
			// find segment 
			if (size <= vmMaxSegmentSize){
				for (auto i = VirtualMemory.size() - 1; i > vmSegmentDataSpace; --i){
					if (VirtualMemory[i].start == addr){
						auto oldSize = (VirtualMemory[i].end - VirtualMemory[i].start);
						if ( oldSize >= size){
							if (VirtualMemoryFreeSegment == VirtualMemory[i].end){
								VirtualMemoryFreeSegment = VirtualMemory[i].start + size;
							}
							VirtualMemory[i].segment.resize(size);
							VirtualMemory[i].end = VirtualMemory[i].start + size;
							dStack.setTop(0);
							dStack.setTop(1, CELL(addr));
							return;
						}
						else {
							// ( addr size -- )
							// allocate new segment instead of current
							memAllocate();
							if (dStack.getTop(0) == 0){
								// (addr addrnew ior -- )
								drop();
								// (addr addrnew -- )
								dup2();
								// (addr addrnew addr addrnew -- )
								dStack.push(oldSize);
								// (addr addrnew addr addrnew u -- )
								cMove();
								// (addr addrnew -- )
								swap();
								// ( addrnew addr -- )
								memFree();
								// ( addrnew  ior(free) -- )
								dStack.setTop(0);
							}
							else {
								// (addr addrnew ior -- )
								pop();
								// (addr addrnew -- )
								dStack.setTop(CELL(errorResize));
								// (addr ior -- )
							}
							return;
						}
					}
				}
			}
			// did not found : ( addr size -- 0 -61 )
			dStack.setTop(static_cast<Cell>(errorResize));
				return;
		}